

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O0

void __thiscall Exttpose::do_invert_db(Exttpose *this,int pblk,int mincustid,int maxcustid)

{
  bool bVar1;
  char cVar2;
  int fd_00;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *__file;
  runtime_error *this_00;
  reference pvVar6;
  void *this_01;
  reference pvVar7;
  int local_224;
  int local_220;
  int fcnt;
  int pub;
  int plb;
  string local_1f8 [8];
  string tmpnam;
  int p;
  int ocid;
  int local_1b8;
  int idx;
  int k;
  int j;
  int i;
  int fd;
  ostringstream tmpname;
  int *local_30;
  int *buf;
  int custid;
  int tid;
  int numitem;
  int maxcustid_local;
  int mincustid_local;
  int pblk_local;
  Exttpose *this_local;
  
  custid = 0;
  buf._4_4_ = 0;
  buf._0_4_ = 0;
  local_30 = (int *)0x0;
  tid = maxcustid;
  numitem = mincustid;
  maxcustid_local = pblk;
  _mincustid_local = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  DbaseCtrlBlk::get_first_blk(&this->dcb);
  DbaseCtrlBlk::get_next_trans(&this->dcb,&local_30,&custid,(int *)((long)&buf + 4),(int *)&buf);
  tmpnam.field_2._12_4_ = 0;
  do {
    if (this->args->num_partitions <= (int)tmpnam.field_2._12_4_) {
      poVar5 = std::operator<<((ostream *)&this->env->logger,"WROTE INVERT ");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
      return;
    }
    std::operator<<((ostream *)&i,(string *)&this->args->output);
    if (1 < this->args->num_partitions) {
      poVar5 = std::operator<<((ostream *)&i,".P");
      std::ostream::operator<<(poVar5,tmpnam.field_2._12_4_);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::string((string *)&pub);
    std::__cxx11::ostringstream::str((string *)&i);
    std::__cxx11::string::~string((string *)&pub);
    __file = (char *)std::__cxx11::string::c_str();
    fd_00 = open(__file,0x241,0x1b6);
    if (fd_00 < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Can\'t open out file");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (k = 0; (ulong)(long)k < this->numfreq; k = k + 1) {
      pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                         (&this->extary,(long)k);
      TransArray::reset(pvVar6);
    }
    iVar3 = tmpnam.field_2._12_4_ * maxcustid_local + numitem;
    local_220 = iVar3 + maxcustid_local;
    if (tid <= local_220) {
      local_220 = tid + 1;
    }
    poVar5 = std::operator<<((ostream *)&this->env->logger,"BOUNDS ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5," ");
    this_01 = (void *)std::ostream::operator<<(poVar5,local_220);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    while (iVar4 = DbaseCtrlBlk::eof(&this->dcb), iVar3 = (int)buf,
          iVar4 == 0 && (int)buf < local_220) {
      local_224 = 0;
      while( true ) {
        iVar4 = DbaseCtrlBlk::eof(&this->dcb);
        bVar1 = false;
        if ((iVar4 == 0) && (bVar1 = false, iVar3 == (int)buf)) {
          bVar1 = (int)buf < local_220;
        }
        if (!bVar1) break;
        if (this->args->use_diff == '\0') {
          for (idx = 0; idx < custid; idx = idx + 1) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->freqidx,(long)local_30[idx]);
            iVar4 = *pvVar7;
            if (iVar4 != -1) {
              if (this->args->use_newformat == '\0') {
                if (this->args->use_seq != 0) {
                  pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                     (&this->extary,(long)iVar4);
                  cVar2 = TransArray::flg(pvVar6);
                  if (cVar2 == '\0') {
                    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&this->fidx,(long)local_224);
                    *pvVar7 = iVar4;
                    local_224 = local_224 + 1;
                    pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                       (&this->extary,(long)iVar4);
                    TransArray::setflg(pvVar6,'\x01');
                    pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                       (&this->extary,(long)iVar4);
                    TransArray::add(pvVar6,fd_00,buf._4_4_,this->args->use_seq,tmpnam.field_2._12_4_
                                    ,(int)buf);
                    goto LAB_0010e940;
                  }
                }
                pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                   (&this->extary,(long)iVar4);
                TransArray::add(pvVar6,fd_00,buf._4_4_,this->args->use_seq,tmpnam.field_2._12_4_,-1)
                ;
              }
              else {
                pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                   (&this->extary,(long)iVar4);
                TransArray::add(pvVar6,fd_00,buf._4_4_,this->args->use_seq,tmpnam.field_2._12_4_,
                                (int)buf);
              }
            }
LAB_0010e940:
          }
        }
        else {
          local_1b8 = 0;
          for (idx = 0; idx < custid; idx = idx + 1) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->freqidx,(long)local_30[idx]);
            if (*pvVar7 != -1) {
              while (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                        (&this->backidx,(long)local_1b8), *pvVar7 < local_30[idx]) {
                if (this->args->use_newformat == '\0') {
                  pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                     (&this->extary,(long)local_1b8);
                  TransArray::add(pvVar6,fd_00,buf._4_4_,this->args->use_seq,tmpnam.field_2._12_4_,
                                  -1);
                }
                else {
                  pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                     (&this->extary,(long)local_1b8);
                  TransArray::add(pvVar6,fd_00,buf._4_4_,this->args->use_seq,tmpnam.field_2._12_4_,
                                  (int)buf);
                }
                local_1b8 = local_1b8 + 1;
              }
              local_1b8 = local_1b8 + 1;
            }
          }
          for (; (ulong)(long)local_1b8 < this->numfreq; local_1b8 = local_1b8 + 1) {
            if (this->args->use_newformat == '\0') {
              pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                 (&this->extary,(long)local_1b8);
              TransArray::add(pvVar6,fd_00,buf._4_4_,this->args->use_seq,tmpnam.field_2._12_4_,-1);
            }
            else {
              pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                                 (&this->extary,(long)local_1b8);
              TransArray::add(pvVar6,fd_00,buf._4_4_,this->args->use_seq,tmpnam.field_2._12_4_,
                              (int)buf);
            }
          }
        }
        DbaseCtrlBlk::get_next_trans
                  (&this->dcb,&local_30,&custid,(int *)((long)&buf + 4),(int *)&buf);
      }
      if ((this->args->use_newformat == '\0') && (this->args->use_seq != 0)) {
        for (local_1b8 = 0; local_1b8 < local_224; local_1b8 = local_1b8 + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)local_1b8);
          pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                             (&this->extary,(long)*pvVar7);
          TransArray::setlastpos(pvVar6);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)local_1b8);
          pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                             (&this->extary,(long)*pvVar7);
          TransArray::setflg(pvVar6,'\0');
        }
      }
    }
    for (k = 0; (ulong)(long)k < this->numfreq; k = k + 1) {
      pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                         (&this->extary,(long)k);
      TransArray::flushbuf(pvVar6,fd_00,this->args->use_seq,tmpnam.field_2._12_4_);
    }
    close(fd_00);
    std::__cxx11::string::~string(local_1f8);
    tmpnam.field_2._12_4_ = tmpnam.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

void Exttpose::do_invert_db(int pblk, int mincustid, int maxcustid) {
    int numitem = 0, tid = 0, custid = 0; // DD: to avoid gcc warning uninitialized var
    int *buf = nullptr; // DD: to avoid gcc warning uninitialized var
    ostringstream tmpname;
    int fd;
    int i, j, k, idx;

    dcb.get_first_blk();
    dcb.get_next_trans(buf, numitem, tid, custid);
    int ocid;// = -1;
    for (int p = 0; p < args.num_partitions; p++) {
        tmpname << args.output;

        if (args.num_partitions > 1) {
            tmpname << ".P" << p;
        }
        
        string tmpnam = tmpname.str();
        tmpname.str(string());

        if ((fd = open(tmpnam.c_str(), (O_WRONLY | O_CREAT | O_TRUNC | O_BINARY), 0666)) < 0) {
            throw runtime_error("Can't open out file");
        }

        for (i = 0; i < numfreq; i++) {
            extary[i].reset();
        }
        //count 2-itemsets
        int plb = p * pblk + mincustid;
        int pub = plb + pblk;
        if (pub >= maxcustid) pub = maxcustid + 1;
        env.logger << "BOUNDS " << plb << " " << pub << endl;
        int fcnt;
        for (; !dcb.eof() && custid < pub;) {
            fcnt = 0;
            ocid = custid;
            //env.logger << "TID " << custid << " " << tid << " " << numitem << endl;
            while (!dcb.eof() && ocid == custid && custid < pub) {
                //for (k=0; k < numitem; k++){

                // }

                if (args.use_diff) {
                    //add this tid to all items not in the trans
                    k = 0;
                    for (j = 0; j < numitem; j++) {
                        if (freqidx[buf[j]] == -1) continue;

                        while (backidx[k] < buf[j]) {
                            //if ((idx = freqidx[backidx[k]]) != -1){
                            idx = k;
                            if (!args.use_newformat)
                                extary[idx].add(fd, tid, args.use_seq, p);
                            else extary[idx].add(fd, tid, args.use_seq, p, custid);
                            //}
                            k++;
                        }
                        k++; //skip over buf[j]
                    }
                    for (; k < numfreq; k++) {
                        //if ((idx = freqidx[backidx[k]]) != -1){
                        idx = k;
                        if (!args.use_newformat)
                            extary[idx].add(fd, tid, args.use_seq, p);
                        else extary[idx].add(fd, tid, args.use_seq, p, custid);
                        //}
                    }
                } else {
                    // add this tid to all items in the trans
                    for (j = 0; j < numitem; j++) {
                        idx = freqidx[buf[j]];
                        if (idx != -1) {
                            if (!args.use_newformat) {
                                if (args.use_seq && extary[idx].flg() == 0) {
                                    fidx[fcnt] = idx;
                                    fcnt++;
                                    extary[idx].setflg(1);
                                    extary[idx].add(fd, tid, args.use_seq, p, custid);
                                } else {
                                    extary[idx].add(fd, tid, args.use_seq, p);
                                }
                            } else {
                                extary[idx].add(fd, tid, args.use_seq, p, custid);
                            }
                        }
                    }
                }

                dcb.get_next_trans(buf, numitem, tid, custid);
            }
            if (!args.use_newformat && args.use_seq) {
                for (k = 0; k < fcnt; k++) {
                    extary[fidx[k]].setlastpos();
                    extary[fidx[k]].setflg(0);
                }
                fcnt = 0;
            }
        }

        for (i = 0; i < numfreq; i++) {
            //env.logger << "FLUSH " << i << " " << extary[i].lastPos << " " <<
            //   extary[i].theSize << endl;
            extary[i].flushbuf(fd, args.use_seq, p);
        }
        close(fd);
    }
    env.logger << "WROTE INVERT " << endl;
}